

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dirichlet.cpp
# Opt level: O3

vector<double,_std::allocator<double>_> *
despot::Dirichlet::Next
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          vector<double,_std::allocator<double>_> *alpha)

{
  pointer pdVar1;
  uint uVar2;
  ulong uVar3;
  double dVar4;
  allocator_type local_39;
  double local_38;
  value_type_conflict3 local_30;
  
  uVar2 = (uint)((ulong)((long)(alpha->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(alpha->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                              super__Vector_impl_data._M_start) >> 3);
  local_30 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,(long)(int)uVar2,&local_30,&local_39);
  if (0 < (int)uVar2) {
    local_38 = 0.0;
    uVar3 = 0;
    do {
      dVar4 = Gamma::Next((alpha->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start[uVar3],1.0);
      (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar3] = dVar4;
      local_38 = local_38 + dVar4;
      uVar3 = uVar3 + 1;
    } while ((uVar2 & 0x7fffffff) != uVar3);
    if (0 < (int)uVar2) {
      pdVar1 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl
               .super__Vector_impl_data._M_start;
      uVar3 = 0;
      do {
        pdVar1[uVar3] = pdVar1[uVar3] / local_38;
        uVar3 = uVar3 + 1;
      } while ((uVar2 & 0x7fffffff) != uVar3);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<double> Dirichlet::Next(vector<double> alpha) {
	int dim = alpha.size();
	vector<double> x(dim, 0);
	double sum = 0;
	for (int i = 0; i < dim; i++) {
		x[i] = Gamma::Next(alpha[i], 1);
		sum = sum + x[i];
	}
	for (int i = 0; i < dim; i++)
		x[i] = x[i] / sum;
	return x;
}